

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void us_internal_ssl_socket_shutdown(us_internal_ssl_socket_t *s)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  us_socket_context_t *context;
  us_loop_t *puVar4;
  
  iVar2 = us_socket_is_closed(0,&s->s);
  if (iVar2 == 0) {
    iVar2 = us_internal_ssl_socket_is_shut_down(s);
    if (iVar2 == 0) {
      context = us_socket_context(0,&s->s);
      puVar4 = us_socket_context_loop(0,context);
      pvVar1 = (puVar4->data).ssl_data;
      *(undefined4 *)((long)pvVar1 + 0x10) = 0;
      *(us_internal_ssl_socket_t **)((long)pvVar1 + 0x18) = s;
      *(undefined4 *)((long)pvVar1 + 0x24) = 0;
      iVar2 = SSL_shutdown((SSL *)s->ssl);
      if (iVar2 == 0) {
        iVar2 = SSL_shutdown((SSL *)s->ssl);
      }
      if (iVar2 < 0) {
        uVar3 = SSL_get_error((SSL *)s->ssl,iVar2);
        if ((uVar3 & 0xfffffffb) == 1) {
          ERR_clear_error();
        }
        us_socket_shutdown(0,&s->s);
        return;
      }
    }
  }
  return;
}

Assistant:

void us_internal_ssl_socket_shutdown(struct us_internal_ssl_socket_t *s) {
    if (!us_socket_is_closed(0, &s->s) && !us_internal_ssl_socket_is_shut_down(s)) {
        struct us_internal_ssl_socket_context_t *context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);
        struct us_loop_t *loop = us_socket_context_loop(0, &context->sc);
        struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) loop->data.ssl_data;

        // also makes no sense to touch this here!
        // however the idea is that if THIS socket is not the same as ssl_socket then this data is not for me
        // but this is not correct as it is currently anyways, any data available should be properly reset
        loop_ssl_data->ssl_read_input_length = 0;


        // essentially we need two of these: one for CURRENT CALL and one for CURRENT SOCKET WITH DATA
        // if those match in the BIO function then you may read, if not then you may not read
        // we need ssl_read_socket to be set in on_data and checked in the BIO
        loop_ssl_data->ssl_socket = &s->s;


        loop_ssl_data->msg_more = 0;

        // sets SSL_SENT_SHUTDOWN no matter what (not actually true if error!)
        int ret = SSL_shutdown(s->ssl);
        if (ret == 0) {
            ret = SSL_shutdown(s->ssl);
        }

        if (ret < 0) {

            int err = SSL_get_error(s->ssl, ret);
            if (err == SSL_ERROR_SSL || err == SSL_ERROR_SYSCALL) {
                // clear
                ERR_clear_error();
            }

            // we get here if we are shutting down while still in init
            us_socket_shutdown(0, &s->s);
        }
    }
}